

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

int png_inflate(png_structrp png_ptr,png_uint_32 owner,int finish,png_const_bytep input,
               png_uint_32p input_size_ptr,png_bytep output,png_alloc_size_t *output_size_ptr)

{
  uInt uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int local_464;
  Bytef local_458 [8];
  Byte local_buffer [1024];
  uInt local_50;
  png_uint_32 local_4c;
  uInt avail;
  png_uint_32 avail_in;
  png_alloc_size_t avail_out;
  int ret;
  png_bytep output_local;
  png_uint_32p input_size_ptr_local;
  png_const_bytep input_local;
  int finish_local;
  png_uint_32 owner_local;
  png_structrp png_ptr_local;
  
  if (png_ptr->zowner == owner) {
    _avail = *output_size_ptr;
    local_4c = *input_size_ptr;
    (png_ptr->zstream).next_in = input;
    (png_ptr->zstream).avail_in = 0;
    (png_ptr->zstream).avail_out = 0;
    if (output != (png_bytep)0x0) {
      (png_ptr->zstream).next_out = output;
    }
    do {
      uVar1 = (png_ptr->zstream).avail_in + local_4c;
      local_50 = 0xffffffff;
      if (uVar1 != 0xffffffff) {
        local_50 = uVar1;
      }
      local_4c = uVar1 - local_50;
      (png_ptr->zstream).avail_in = local_50;
      uVar3 = (png_ptr->zstream).avail_out + _avail;
      local_50 = 0xffffffff;
      if (output == (png_bytep)0x0) {
        (png_ptr->zstream).next_out = local_458;
        local_50 = 0x400;
      }
      if (uVar3 < local_50) {
        local_50 = (uInt)uVar3;
      }
      (png_ptr->zstream).avail_out = local_50;
      _avail = uVar3 - local_50;
      if (_avail == 0) {
        local_464 = 2;
        if (finish != 0) {
          local_464 = 4;
        }
      }
      else {
        local_464 = 0;
      }
      png_ptr_local._4_4_ = png_zlib_inflate(png_ptr,local_464);
    } while (png_ptr_local._4_4_ == 0);
    if (output == (png_bytep)0x0) {
      (png_ptr->zstream).next_out = (Bytef *)0x0;
    }
    iVar2 = (png_ptr->zstream).avail_in + local_4c;
    lVar4 = (png_ptr->zstream).avail_out + _avail;
    if (lVar4 != 0) {
      *output_size_ptr = *output_size_ptr - lVar4;
    }
    if (iVar2 != 0) {
      *input_size_ptr = *input_size_ptr - iVar2;
    }
    png_zstream_error(png_ptr,png_ptr_local._4_4_);
  }
  else {
    (png_ptr->zstream).msg = "zstream unclaimed";
    png_ptr_local._4_4_ = -2;
  }
  return png_ptr_local._4_4_;
}

Assistant:

static int
png_inflate(png_structrp png_ptr, png_uint_32 owner, int finish,
    /* INPUT: */ png_const_bytep input, png_uint_32p input_size_ptr,
    /* OUTPUT: */ png_bytep output, png_alloc_size_t *output_size_ptr)
{
   if (png_ptr->zowner == owner) /* Else not claimed */
   {
      int ret;
      png_alloc_size_t avail_out = *output_size_ptr;
      png_uint_32 avail_in = *input_size_ptr;

      /* zlib can't necessarily handle more than 65535 bytes at once (i.e. it
       * can't even necessarily handle 65536 bytes) because the type uInt is
       * "16 bits or more".  Consequently it is necessary to chunk the input to
       * zlib.  This code uses ZLIB_IO_MAX, from pngpriv.h, as the maximum (the
       * maximum value that can be stored in a uInt.)  It is possible to set
       * ZLIB_IO_MAX to a lower value in pngpriv.h and this may sometimes have
       * a performance advantage, because it reduces the amount of data accessed
       * at each step and that may give the OS more time to page it in.
       */
      png_ptr->zstream.next_in = PNGZ_INPUT_CAST(input);
      /* avail_in and avail_out are set below from 'size' */
      png_ptr->zstream.avail_in = 0;
      png_ptr->zstream.avail_out = 0;

      /* Read directly into the output if it is available (this is set to
       * a local buffer below if output is NULL).
       */
      if (output != NULL)
         png_ptr->zstream.next_out = output;

      do
      {
         uInt avail;
         Byte local_buffer[PNG_INFLATE_BUF_SIZE];

         /* zlib INPUT BUFFER */
         /* The setting of 'avail_in' used to be outside the loop; by setting it
          * inside it is possible to chunk the input to zlib and simply rely on
          * zlib to advance the 'next_in' pointer.  This allows arbitrary
          * amounts of data to be passed through zlib at the unavoidable cost of
          * requiring a window save (memcpy of up to 32768 output bytes)
          * every ZLIB_IO_MAX input bytes.
          */
         avail_in += png_ptr->zstream.avail_in; /* not consumed last time */

         avail = ZLIB_IO_MAX;

         if (avail_in < avail)
            avail = (uInt)avail_in; /* safe: < than ZLIB_IO_MAX */

         avail_in -= avail;
         png_ptr->zstream.avail_in = avail;

         /* zlib OUTPUT BUFFER */
         avail_out += png_ptr->zstream.avail_out; /* not written last time */

         avail = ZLIB_IO_MAX; /* maximum zlib can process */

         if (output == NULL)
         {
            /* Reset the output buffer each time round if output is NULL and
             * make available the full buffer, up to 'remaining_space'
             */
            png_ptr->zstream.next_out = local_buffer;
            if ((sizeof local_buffer) < avail)
               avail = (sizeof local_buffer);
         }

         if (avail_out < avail)
            avail = (uInt)avail_out; /* safe: < ZLIB_IO_MAX */

         png_ptr->zstream.avail_out = avail;
         avail_out -= avail;

         /* zlib inflate call */
         /* In fact 'avail_out' may be 0 at this point, that happens at the end
          * of the read when the final LZ end code was not passed at the end of
          * the previous chunk of input data.  Tell zlib if we have reached the
          * end of the output buffer.
          */
         ret = PNG_INFLATE(png_ptr, avail_out > 0 ? Z_NO_FLUSH :
             (finish ? Z_FINISH : Z_SYNC_FLUSH));
      } while (ret == Z_OK);

      /* For safety kill the local buffer pointer now */
      if (output == NULL)
         png_ptr->zstream.next_out = NULL;

      /* Claw back the 'size' and 'remaining_space' byte counts. */
      avail_in += png_ptr->zstream.avail_in;
      avail_out += png_ptr->zstream.avail_out;

      /* Update the input and output sizes; the updated values are the amount
       * consumed or written, effectively the inverse of what zlib uses.
       */
      if (avail_out > 0)
         *output_size_ptr -= avail_out;

      if (avail_in > 0)
         *input_size_ptr -= avail_in;

      /* Ensure png_ptr->zstream.msg is set (even in the success case!) */
      png_zstream_error(png_ptr, ret);
      return ret;
   }

   else
   {
      /* This is a bad internal error.  The recovery assigns to the zstream msg
       * pointer, which is not owned by the caller, but this is safe; it's only
       * used on errors!
       */
      png_ptr->zstream.msg = PNGZ_MSG_CAST("zstream unclaimed");
      return Z_STREAM_ERROR;
   }
}